

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

uint8_t * MuxImageEmit(WebPMuxImage *wpi,uint8_t *dst)

{
  uint32_t uVar1;
  WebPChunk *pWVar2;
  ulong __n;
  int iVar3;
  size_t sVar4;
  uint8_t *puVar5;
  
  pWVar2 = wpi->header;
  if (pWVar2 != (WebPChunk *)0x0) {
    sVar4 = MuxImageDiskSize(wpi);
    __n = (pWVar2->data).size;
    uVar1 = pWVar2->tag;
    *dst = (uint8_t)uVar1;
    dst[1] = (uint8_t)(uVar1 >> 8);
    dst[2] = (uint8_t)(uVar1 >> 0x10);
    dst[3] = (uint8_t)(uVar1 >> 0x18);
    iVar3 = (int)sVar4 + -8;
    dst[4] = (uint8_t)iVar3;
    dst[5] = (uint8_t)((uint)iVar3 >> 8);
    dst[6] = (uint8_t)((uint)iVar3 >> 0x10);
    dst[7] = (uint8_t)((uint)iVar3 >> 0x18);
    memcpy(dst + 8,(pWVar2->data).bytes,__n);
    if ((__n & 1) != 0) {
      dst[__n + 8] = '\0';
    }
    dst = dst + (ulong)((int)(pWVar2->data).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->alpha != (WebPChunk *)0x0) {
    dst = ChunkEmit(wpi->alpha,dst);
  }
  if (wpi->img != (WebPChunk *)0x0) {
    dst = ChunkEmit(wpi->img,dst);
  }
  if (wpi->unknown != (WebPChunk *)0x0) {
    puVar5 = ChunkListEmit(wpi->unknown,dst);
    return puVar5;
  }
  return dst;
}

Assistant:

uint8_t* MuxImageEmit(const WebPMuxImage* const wpi, uint8_t* dst) {
  // Ordering of chunks to be emitted is strictly as follows:
  // 1. ANMF chunk (if present).
  // 2. ALPH chunk (if present).
  // 3. VP8/VP8L chunk.
  assert(wpi);
  if (wpi->header != NULL) {
    dst = ChunkEmitSpecial(wpi->header, MuxImageDiskSize(wpi), dst);
  }
  if (wpi->alpha != NULL) dst = ChunkEmit(wpi->alpha, dst);
  if (wpi->img != NULL) dst = ChunkEmit(wpi->img, dst);
  if (wpi->unknown != NULL) dst = ChunkListEmit(wpi->unknown, dst);
  return dst;
}